

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::init(PartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  NativeDisplay *pNVar1;
  bool bVar2;
  Visibility VVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  GLenum err;
  EGLDisplay pvVar7;
  Library *pLVar8;
  FilterList *this_00;
  EGLConfig pvVar9;
  NativeWindowFactory *pNVar10;
  undefined4 extraout_var;
  EGLSurface pvVar11;
  undefined4 extraout_var_00;
  GLES2Renderer *pGVar12;
  ReferenceRenderer *pRVar13;
  NotSupportedError *this_01;
  pointer_____offset_0x10___ *ppuVar14;
  allocator<char> local_152;
  allocator<char> local_151;
  Library *local_150;
  string local_148;
  string local_128;
  undefined1 local_108 [216];
  
  local_150 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar7;
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar7 = this->m_eglDisplay;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<((FilterList *)local_108,isWindow);
  eglu::FilterList::operator<<(this_00,isES2Renderable);
  pvVar9 = eglu::chooseSingleConfig(pLVar8,pvVar7,(FilterList *)local_108);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                   *)local_108);
  this->m_eglConfig = pvVar9;
  pNVar10 = eglu::selectNativeWindowFactory
                      (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar7 = this->m_eglDisplay;
  pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  VVar3 = eglu::parseWindowVisibility
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_108._0_8_ = (pointer)0x1e0000001e0;
  local_108._8_4_ = VVar3;
  iVar4 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar10,pNVar1,pvVar7,pvVar9,0,local_108);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar4);
  pvVar11 = eglu::createWindowSurface
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar4),this->m_eglDisplay,
                       pvVar9,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar11;
  pvVar9 = this->m_eglConfig;
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_108._0_8_ = (pointer)0x200003098;
  local_108._8_4_ = 0x3038;
  (**pLVar8->_vptr_Library)(pLVar8,0x30a0);
  iVar4 = (*pLVar8->_vptr_Library[6])(pLVar8,this->m_eglDisplay,pvVar9,0,local_108);
  this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar4);
  dVar5 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar5,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                   ,0x1bb);
  pvVar11 = this->m_eglSurface;
  if (pvVar11 == (EGLSurface)0x0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_01,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
               ,0x1bc);
    ppuVar14 = &tcu::TestError::typeinfo;
  }
  else {
    (*pLVar8->_vptr_Library[0x27])(pLVar8,this->m_eglDisplay,pvVar11,pvVar11,this->m_eglContext);
    dVar5 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
    eglu::checkError(dVar5,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,0x1be);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pvVar7 = this->m_eglDisplay;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"EGL_EXT_buffer_age",(allocator<char> *)&local_148);
    pLVar8 = local_150;
    bVar2 = eglu::hasExtension(local_150,pvVar7,(string *)local_108);
    this->m_supportBufferAge = bVar2;
    std::__cxx11::string::~string((string *)local_108);
    pvVar7 = this->m_eglDisplay;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"EGL_KHR_partial_update",(allocator<char> *)&local_148);
    bVar2 = eglu::hasExtension(pLVar8,pvVar7,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    if (bVar2) {
      pGVar12 = (GLES2Renderer *)operator_new(0xe0);
      pGVar12->m_gl = dst;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,
                 "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
                 ,&local_151);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,
                 "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",
                 &local_152);
      glu::makeVtxFragSources((ProgramSources *)local_108,&local_148,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      glu::ShaderProgram::ShaderProgram(&pGVar12->m_glProgram,dst,(ProgramSources *)local_108);
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_108);
      pGVar12->m_coordLoc = 0xffffffff;
      pGVar12->m_colorLoc = 0xffffffff;
      GVar6 = (*pGVar12->m_gl->getAttribLocation)
                        ((pGVar12->m_glProgram).m_program.m_program,"a_color");
      pGVar12->m_colorLoc = GVar6;
      GVar6 = (*pGVar12->m_gl->getAttribLocation)
                        ((pGVar12->m_glProgram).m_program.m_program,"a_pos");
      pGVar12->m_coordLoc = GVar6;
      err = (*pGVar12->m_gl->getError)();
      glu::checkError(err,"Failed to get attribute locations",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0xef);
      this->m_gles2Renderer = pGVar12;
      pRVar13 = (ReferenceRenderer *)operator_new(1);
      this->m_refRenderer = pRVar13;
      return (int)pRVar13;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"EGL_KHR_partial_update is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
               ,0x181);
    ppuVar14 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar14,tcu::Exception::~Exception);
}

Assistant:

void PartialUpdateTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig			= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay);

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_supportBufferAge = eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age");

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}